

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::weight(vector<float,_std::allocator<float>_> *__return_storage_ptr__,MXNetNode *this,
                 int i,int init_len)

{
  pointer piVar1;
  pointer pMVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer pMVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  value_type_conflict2 local_40;
  value_type_conflict2 local_3c;
  size_type local_38;
  
  if (((-1 < i) &&
      (piVar1 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
      i < (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) &&
     (pMVar6 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
               super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(this->params->
                             super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar6) >> 3) * -0x45d1745d))
  {
    iVar4 = piVar1[(uint)i];
    pMVar2 = (this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (size_type)init_len;
    lVar8 = 0x20;
    lVar5 = 0;
    do {
      __n = *(size_t *)((long)pMVar6 + lVar8 + -0x18);
      bVar9 = true;
      if (__n == pMVar2[iVar4].name._M_string_length) {
        if (__n == 0) {
          bVar9 = false;
        }
        else {
          iVar3 = bcmp(*(void **)((long)pMVar6 + lVar8 + -0x20),pMVar2[iVar4].name._M_dataplus._M_p,
                       __n);
          bVar9 = iVar3 != 0;
        }
      }
      if (!bVar9) {
        if (*(long *)((long)&(pMVar6->name)._M_dataplus._M_p + lVar8) !=
            *(long *)((long)&(pMVar6->name)._M_string_length + lVar8)) {
          std::vector<float,_std::allocator<float>_>::vector
                    (__return_storage_ptr__,
                     (vector<float,_std::allocator<float>_> *)
                     ((long)&(pMVar6->name)._M_dataplus._M_p + lVar8));
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (init_len == 0) {
          return __return_storage_ptr__;
        }
        if (*(long *)((long)&(pMVar6->data).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl + lVar8) == 0) {
          return __return_storage_ptr__;
        }
        pcVar7 = (pMVar6->name).field_2._M_local_buf + lVar8 + 8;
        iVar4 = std::__cxx11::string::compare(pcVar7);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare(pcVar7);
          if (iVar4 != 0) {
            return __return_storage_ptr__;
          }
          local_40 = 1.0;
          std::vector<float,_std::allocator<float>_>::resize
                    (__return_storage_ptr__,local_38,&local_40);
          return __return_storage_ptr__;
        }
        local_3c = 0.0;
        std::vector<float,_std::allocator<float>_>::resize
                  (__return_storage_ptr__,local_38,&local_3c);
        return __return_storage_ptr__;
      }
      lVar5 = lVar5 + 1;
      pMVar6 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x58;
    } while (lVar5 < (int)((ulong)((long)(this->params->
                                         super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6)
                          >> 3) * -0x45d1745d);
  }
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> MXNetNode::weight(int i, int init_len) const
{
    if (i < 0 || i >= (int)weights.size())
        return std::vector<float>();

    const std::string& name = (*nodes)[ weights[i] ].name;

    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name != name)
            continue;

        if (!p.data.empty())
            return p.data;

        std::vector<float> data;

        if (!p.init.empty() && init_len != 0)
        {
            if (p.init == "[\\$zero\\$, {}]")
            {
                data.resize(init_len, 0.f);
            }
            else if (p.init == "[\\$one\\$, {}]")
            {
                data.resize(init_len, 1.f);
            }
        }

        return data;
    }

    return std::vector<float>();
}